

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int fftheap(fitsfile *fptr,LONGLONG *heapsz,LONGLONG *unused,LONGLONG *overlap,int *valid,
           int *status)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  FITSfile *pFVar8;
  long lVar9;
  int typecode;
  void *local_c8;
  size_t local_c0;
  int *local_b8;
  size_t *local_b0;
  long *local_a8;
  long *local_a0;
  LONGLONG offset;
  LONGLONG repeat;
  char message [81];
  
  if (0 < *status) {
    return *status;
  }
  local_b8 = valid;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    iVar2 = ffrdef(fptr,status);
    if (0 < iVar2) goto LAB_00142256;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (local_b8 != (int *)0x0) {
    *local_b8 = 1;
  }
  if (heapsz != (LONGLONG *)0x0) {
    *heapsz = fptr->Fptr->heapsize;
  }
  if (unused != (LONGLONG *)0x0) {
    *unused = 0;
  }
  if (overlap != (LONGLONG *)0x0) {
    *overlap = 0;
  }
  pFVar8 = fptr->Fptr;
  if ((pFVar8->hdutype == 2) && (local_c0 = pFVar8->heapsize, local_c0 != 0)) {
    local_c8 = calloc(1,local_c0);
    if (local_c8 == (void *)0x0) {
      builtin_strncpy(message + 0x20,"t the heap",0xb);
      builtin_strncpy(message + 0x10,"te buffer to tes",0x10);
      builtin_strncpy(message,"Failed to alloca",0x10);
      ffpmsg(message);
      *status = 0x71;
      return 0x71;
    }
    iVar2 = 1;
    local_b0 = (size_t *)heapsz;
    local_a8 = unused;
    local_a0 = overlap;
    while ((iVar2 <= pFVar8->tfield && (*status < 1))) {
      ffgtcl(fptr,iVar2,&typecode,(long *)0x0,(long *)0x0,status);
      if (typecode < 1) {
        uVar3 = -typecode;
        for (lVar9 = 1; pFVar8 = fptr->Fptr, lVar9 <= pFVar8->numrows; lVar9 = lVar9 + 1) {
          ffgdesll(fptr,iVar2,lVar9,&repeat,&offset,status);
          if (typecode == -1) {
            lVar4 = (repeat + 7) / 8;
          }
          else {
            lVar4 = repeat * ((ulong)uVar3 / 10);
          }
          if ((offset < 0) || ((long)local_c0 < offset + lVar4)) {
            if (local_b8 != (int *)0x0) {
              *local_b8 = 0;
            }
            snprintf(message,0x51,"Descriptor in row %ld, column %d has invalid heap address");
            ffpmsg(message);
          }
          else {
            if (lVar4 < 1) {
              lVar4 = 0;
            }
            for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
              pcVar1 = (char *)((long)local_c8 + lVar5 + offset);
              *pcVar1 = *pcVar1 + '\x01';
            }
          }
        }
      }
      else {
        pFVar8 = fptr->Fptr;
      }
      iVar2 = iVar2 + 1;
    }
    sVar6 = 0;
    sVar7 = 0;
    if (0 < (long)local_c0) {
      sVar7 = local_c0;
    }
    lVar4 = 0;
    lVar9 = 0;
    for (; sVar7 != sVar6; sVar6 = sVar6 + 1) {
      lVar9 = lVar9 + (ulong)('\x01' < *(char *)((long)local_c8 + sVar6));
      lVar4 = lVar4 + (ulong)(*(char *)((long)local_c8 + sVar6) == '\0');
    }
    if (local_b0 != (size_t *)0x0) {
      *local_b0 = local_c0;
    }
    if (local_a8 != (long *)0x0) {
      *local_a8 = lVar4;
    }
    if (local_a0 != (long *)0x0) {
      *local_a0 = lVar9;
    }
    free(local_c8);
  }
LAB_00142256:
  return *status;
}

Assistant:

int fftheap(fitsfile *fptr, /* I - FITS file pointer                         */
           LONGLONG *heapsz,   /* O - current size of the heap               */
           LONGLONG *unused,   /* O - no. of unused bytes in the heap        */
           LONGLONG *overlap,  /* O - no. of bytes shared by > 1 descriptors */
           int  *valid,     /* O - are all the heap addresses valid?         */
           int *status)     /* IO - error status                             */
/*
  Tests the contents of the binary table variable length array heap.
  Returns the number of bytes that are currently not pointed to by any
  of the descriptors, and also the number of bytes that are pointed to
  by more than one descriptor.  It returns valid = FALSE if any of the
  descriptors point to addresses that are out of the bounds of the
  heap.
*/
{
    int jj, typecode, pixsize;
    long ii, kk, theapsz, nbytes;
    LONGLONG repeat, offset, tunused = 0, toverlap = 0;
    char *buffer, message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if ( fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header to make sure everything is up to date */
    else if ( ffrdef(fptr, status) > 0)               
        return(*status);

    if (valid) *valid = TRUE;
    if (heapsz) *heapsz = (fptr->Fptr)->heapsize;
    if (unused) *unused = 0;
    if (overlap) *overlap = 0;
    
    /* return if this is not a binary table HDU or if the heap is empty */
    if ( (fptr->Fptr)->hdutype != BINARY_TBL || (fptr->Fptr)->heapsize == 0 )
        return(*status);

    if ((fptr->Fptr)->heapsize > LONG_MAX) {
        ffpmsg("Heap is too big to test ( > 2**31 bytes). (fftheap)");
        return(*status = MEMORY_ALLOCATION);
    }

    theapsz = (long) (fptr->Fptr)->heapsize;
    buffer = calloc(1, theapsz);     /* allocate temp space */
    if (!buffer )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to allocate buffer to test the heap");
        ffpmsg(message);
        return(*status = MEMORY_ALLOCATION);
    }

    /* loop over all cols */
    for (jj = 1; jj <= (fptr->Fptr)->tfield && *status <= 0; jj++)
    {
        ffgtcl(fptr, jj, &typecode, NULL, NULL, status);
        if (typecode > 0)
           continue;        /* ignore fixed length columns */

        pixsize = -typecode / 10;

        for (ii = 1; ii <= (fptr->Fptr)->numrows; ii++)
        {
            ffgdesll(fptr, jj, ii, &repeat, &offset, status);
            if (typecode == -TBIT)
                nbytes = (long) (repeat + 7) / 8;
            else
                nbytes = (long) repeat * pixsize;

            if (offset < 0 || offset + nbytes > theapsz)
            {
                if (valid) *valid = FALSE;  /* address out of bounds */
                snprintf(message,FLEN_ERRMSG,
                "Descriptor in row %ld, column %d has invalid heap address",
                ii, jj);
                ffpmsg(message);
            }
            else
            {
                for (kk = 0; kk < nbytes; kk++)
                    buffer[kk + offset]++;   /* increment every used byte */
            }
        }
    }

    for (kk = 0; kk < theapsz; kk++)
    {
        if (buffer[kk] == 0)
            tunused++;
        else if (buffer[kk] > 1)
            toverlap++;
    }

    if (heapsz) *heapsz = theapsz;
    if (unused) *unused = tunused;
    if (overlap) *overlap = toverlap;

    free(buffer);
    return(*status);
}